

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_private.hh
# Opt level: O2

void QPDF::Writer::optimize
               (QPDF *qpdf,ObjTable *obj,function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  function<int_(QPDFObjectHandle_&)> fStack_38;
  
  std::function<int_(QPDFObjectHandle_&)>::function(&fStack_38,skip_stream_parameters);
  QPDF::optimize(qpdf,obj,&fStack_38);
  std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  return;
}

Assistant:

static void
    optimize(
        QPDF& qpdf,
        QPDFWriter::ObjTable const& obj,
        std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
    {
        qpdf.optimize(obj, skip_stream_parameters);
    }